

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O1

_Bool i2cp_parse_payload(i2cp_payload *p)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  _Bool _Var4;
  
  puVar1 = p->ptr;
  p->srcport = *(ushort *)(puVar1 + 4) << 8 | *(ushort *)(puVar1 + 4) >> 8;
  p->dstport = *(ushort *)(puVar1 + 6) << 8 | *(ushort *)(puVar1 + 6) >> 8;
  p->proto = puVar1[9];
  (p->gzip).adler = 0;
  (p->gzip).reserved = 0;
  (p->gzip).opaque = (voidpf)0x0;
  *(undefined8 *)&(p->gzip).data_type = 0;
  (p->gzip).zalloc = (alloc_func)0x0;
  (p->gzip).zfree = (free_func)0x0;
  (p->gzip).msg = (char *)0x0;
  (p->gzip).state = (internal_state *)0x0;
  *(undefined8 *)&(p->gzip).avail_out = 0;
  (p->gzip).total_out = 0;
  (p->gzip).total_in = 0;
  (p->gzip).next_out = (Bytef *)0x0;
  (p->gzip).next_in = (Bytef *)0x0;
  *(undefined8 *)&(p->gzip).avail_in = 0;
  inflateInit2_(p,0x1f,"1.2.11",0x70);
  (p->gzip).next_in = p->ptr;
  (p->gzip).avail_in = p->ptrlen;
  (p->gzip).next_out = p->payload;
  (p->gzip).avail_out = 0x10000;
  _Var4 = false;
  iVar2 = inflate(p,0);
  if (iVar2 == 1) {
    uVar3 = 0x10000 - (ulong)(p->gzip).avail_out;
    p->sz = uVar3;
    _Var4 = uVar3 < 0x10001;
  }
  inflateEnd(p);
  return _Var4;
}

Assistant:

bool i2cp_parse_payload(struct i2cp_payload * p)
{
  bool ret = false;
  int err;

  p->srcport = bufbe16toh(p->ptr + 4);
  p->dstport = bufbe16toh(p->ptr + 6);
  p->proto = p->ptr[9];
  
  z_stream * gzip = &p->gzip;
  
  memset(gzip, 0, sizeof(z_stream));
  inflateInit2(gzip, MAX_WBITS + 16);

  gzip->next_in = p->ptr;
  gzip->avail_in = p->ptrlen;
  gzip->next_out = p->payload;
  gzip->avail_out = sizeof(p->payload);

  err = inflate(gzip, Z_NO_FLUSH);
  if(err == Z_STREAM_END)
  {
    p->sz = sizeof(p->payload) - gzip->avail_out;
    ret = p->sz <= sizeof(p->payload);
  }
  inflateEnd(gzip);
  return ret;
}